

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_Boolean HTS_get_token_from_fp(HTS_File *fp,char *buff)

{
  int iVar1;
  long in_RSI;
  long lVar2;
  long in_RDI;
  bool bVar3;
  size_t i;
  char c;
  HTS_File *in_stack_ffffffffffffffc8;
  long local_28;
  char local_19;
  
  if ((in_RDI == 0) || (iVar1 = HTS_feof(in_stack_ffffffffffffffc8), iVar1 != 0)) {
    return '\0';
  }
  iVar1 = HTS_fgetc(in_stack_ffffffffffffffc8);
  local_19 = (char)iVar1;
  while( true ) {
    bVar3 = true;
    if ((local_19 != ' ') && (bVar3 = true, local_19 != '\n')) {
      bVar3 = local_19 == '\t';
    }
    if (!bVar3) break;
    iVar1 = HTS_feof(in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      return '\0';
    }
    iVar1 = HTS_fgetc(in_stack_ffffffffffffffc8);
    local_19 = (char)iVar1;
    if (local_19 == -1) {
      return '\0';
    }
  }
  local_28 = 0;
  do {
    bVar3 = false;
    if ((local_19 != ' ') && (bVar3 = false, local_19 != '\n')) {
      bVar3 = local_19 != '\t';
    }
    if (!bVar3) break;
    lVar2 = local_28 + 1;
    *(char *)(in_RSI + local_28) = local_19;
    iVar1 = HTS_feof(in_stack_ffffffffffffffc8);
    local_28 = lVar2;
    if (iVar1 != 0) break;
    iVar1 = HTS_fgetc(in_stack_ffffffffffffffc8);
    local_19 = (char)iVar1;
  } while (local_19 != -1);
  *(undefined1 *)(in_RSI + local_28) = 0;
  return '\x01';
}

Assistant:

HTS_Boolean HTS_get_token_from_fp(HTS_File * fp, char *buff)
{
   char c;
   size_t i;

   if (fp == NULL || HTS_feof(fp))
      return FALSE;
   c = HTS_fgetc(fp);
   while (c == ' ' || c == '\n' || c == '\t') {
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      if (c == EOF)
         return FALSE;
   }

   for (i = 0; c != ' ' && c != '\n' && c != '\t';) {
      buff[i++] = c;
      if (HTS_feof(fp))
         break;
      c = HTS_fgetc(fp);
      if (c == EOF)
         break;
   }

   buff[i] = '\0';
   return TRUE;
}